

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_zip(DisasContext_conflict1 *s,arg_rrr_esz *a,_Bool high)

{
  uint oprsz;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar1;
  undefined1 extraout_AL;
  uint uVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = sve_access_check_aarch64(s);
  if ((bool)uVar1) {
    oprsz = s->sve_len;
    uVar2 = 0;
    if (high) {
      uVar2 = oprsz >> 1;
    }
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + uVar2 + 0xc10,
               uVar2 + a->rm * 0x100 + 0xc10,oprsz,oprsz,0,
               (gen_helper_gvec_3_conflict1 *)do_zip::fns[a->esz]);
    uVar1 = extraout_AL;
  }
  return (_Bool)uVar1;
}

Assistant:

static bool do_zip(DisasContext *s, arg_rrr_esz *a, bool high)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_zip_b, gen_helper_sve_zip_h,
        gen_helper_sve_zip_s, gen_helper_sve_zip_d,
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        unsigned high_ofs = high ? vsz / 2 : 0;
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn) + high_ofs,
                           vec_full_reg_offset(s, a->rm) + high_ofs,
                           vsz, vsz, 0, fns[a->esz]);
    }
    return true;
}